

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

NumericExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadNumericExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this,int opcode)

{
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
  other;
  VarArgHandler handler;
  NumericArgHandler handler_00;
  NumberOfArgHandler handler_01;
  SymbolicArgHandler handler_02;
  NumericExpr arg;
  NumericExpr else_expr_00;
  Reference arg_00;
  PLTermHandler handler_03;
  int iVar1;
  int in_ESI;
  undefined8 *in_RDI;
  double dVar2;
  SymbolicArgHandler SVar3;
  SymbolicArgHandler args_4;
  int num_args_3;
  NumberOfArgHandler args_3;
  int num_args_2;
  NumericArgHandler args_2;
  int num_args_1;
  VarArgHandler args_1;
  int num_args;
  int i;
  PLTermHandler pl_handler;
  int num_slopes;
  NumericExpr else_expr;
  NumericExpr then_expr;
  LogicalExpr condition;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::NumericExprReader>
  args;
  Kind kind;
  OpCodeInfo *info;
  undefined8 in_stack_fffffffffffffde8;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_stack_fffffffffffffdf0;
  bool ignore_zero;
  undefined1 ignore_zero_00;
  int in_stack_fffffffffffffdf8;
  Kind in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 uVar4;
  Kind in_stack_fffffffffffffe04;
  int num_args_00;
  undefined4 in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  ExprBase in_stack_fffffffffffffe10;
  Impl *pIVar5;
  ExprBase in_stack_fffffffffffffe18;
  CStringRef in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  BasicCStringRef<char> local_1c0;
  Impl *local_1b8;
  undefined8 local_1b0;
  Impl *local_1a8;
  int local_1a0;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_stack_fffffffffffffe68;
  undefined4 uStack_184;
  int local_a4;
  PLTermHandler local_a0;
  BasicCStringRef<char> local_90;
  int local_84;
  ExprBase local_80;
  Impl *local_78;
  Impl *local_70;
  ExprBase local_68;
  ExprBase local_60;
  ExprBase local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  ExprBase local_30;
  Kind local_24;
  OpCodeInfo *local_20;
  ExprBase local_8;
  
  iVar1 = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  local_20 = GetOpCodeInfo(in_ESI);
  local_24 = local_20->kind;
  switch(local_20->first_kind) {
  case FIRST_UNARY:
    local_30.impl_ =
         (Impl *)ReadNumericExpr((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                                 SUB81((ulong)in_stack_fffffffffffffdf0 >> 0x38,0));
    arg.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffe0c;
    arg.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffe08;
    local_8.impl_ =
         (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnUnary
                           ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                            CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                            in_stack_fffffffffffffdfc,arg);
    break;
  default:
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_1c0,"expected numeric expression opcode");
    BinaryReaderBase::ReportError<>
              ((BinaryReaderBase *)in_stack_fffffffffffffe18.impl_,in_stack_fffffffffffffe20);
    BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr
              ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)0x4e4798);
    break;
  case ADD:
    BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::NumericExprReader>
    ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::NumericExprReader>
                       *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                      (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    local_48 = local_40;
    local_50 = local_38;
    local_8.impl_ =
         (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnBinary
                           ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                            CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                            in_stack_fffffffffffffe04,(NumericExpr)in_stack_fffffffffffffe18.impl_,
                            (NumericExpr)in_stack_fffffffffffffe10.impl_);
    break;
  case IF:
    local_58.impl_ =
         (Impl *)ReadLogicalExpr((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                                  *)in_stack_fffffffffffffe18.impl_);
    ignore_zero = SUB81((ulong)in_stack_fffffffffffffdf0 >> 0x38,0);
    local_60.impl_ =
         (Impl *)ReadNumericExpr((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                                 ignore_zero);
    local_80.impl_ =
         (Impl *)ReadNumericExpr((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                                 ignore_zero);
    local_70 = local_58.impl_;
    local_78 = local_60.impl_;
    else_expr_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffe0c;
    else_expr_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffe08;
    local_68.impl_ = local_80.impl_;
    local_8.impl_ =
         (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnIf
                           ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                            CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                            (LogicalExpr)in_stack_fffffffffffffe18.impl_,
                            (NumericExpr)in_stack_fffffffffffffe10.impl_,else_expr_00);
    break;
  case PLTERM:
    local_84 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                         ((BinaryReader<mp::internal::EndiannessConverter> *)
                          CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    if (local_84 < 2) {
      in_stack_fffffffffffffe18.impl_ = (Impl *)*in_RDI;
      fmt::BasicCStringRef<char>::BasicCStringRef
                (&local_90,"too few slopes in piecewise-linear term");
      BinaryReaderBase::ReportError<>
                ((BinaryReaderBase *)in_stack_fffffffffffffe18.impl_,in_stack_fffffffffffffe20);
    }
    BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
    local_a0 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginPLTerm
                         ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                          in_stack_fffffffffffffdf0,iVar1);
    for (local_a4 = 0; local_a4 < local_84 + -1; local_a4 = local_a4 + 1) {
      dVar2 = ReadConstant(in_stack_fffffffffffffdf0);
      BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope(&local_a0,dVar2);
      dVar2 = ReadConstant(in_stack_fffffffffffffdf0);
      BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddBreakpoint(&local_a0,dVar2);
    }
    dVar2 = ReadConstant(in_stack_fffffffffffffdf0);
    BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope(&local_a0,dVar2);
    pIVar5 = (Impl *)in_RDI[2];
    ReadReference((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    handler_03._8_8_ = in_stack_fffffffffffffe18.impl_;
    handler_03.impl_ = pIVar5;
    arg_00.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._4_4_ =
         in_stack_fffffffffffffe0c;
    arg_00.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._0_4_ =
         in_stack_fffffffffffffe08;
    local_8.impl_ =
         (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::EndPLTerm
                           ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                            CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),handler_03
                            ,arg_00);
    break;
  case FIRST_ITERATED:
    ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                in_stack_fffffffffffffdfc);
    NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginVarArg
              ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
    ::
    ReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::NumericExprReader,mp::BasicExprFactory<std::allocator<char>>::BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>>
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               in_stack_fffffffffffffdfc,
               (BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>_>
                *)in_stack_fffffffffffffdf0);
    handler.impl_._4_4_ = in_stack_fffffffffffffe04;
    handler.impl_._0_4_ = in_stack_fffffffffffffe00;
    handler.arg_index_ = in_stack_fffffffffffffe08;
    handler._12_4_ = in_stack_fffffffffffffe0c;
    local_8.impl_ =
         (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::EndVarArg
                           ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                            CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),handler);
    break;
  case SUM:
    ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                in_stack_fffffffffffffdfc);
    NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginSum
              ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               in_stack_fffffffffffffdfc);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
    ::
    ReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::NumericExprReader,mp::BasicExprFactory<std::allocator<char>>::BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>>
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               in_stack_fffffffffffffdfc,
               (BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>_>
                *)in_stack_fffffffffffffdf0);
    handler_00.impl_._4_4_ = in_stack_fffffffffffffe04;
    handler_00.impl_._0_4_ = in_stack_fffffffffffffe00;
    handler_00.arg_index_ = in_stack_fffffffffffffe08;
    handler_00._12_4_ = in_stack_fffffffffffffe0c;
    local_8.impl_ =
         (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::EndSum
                           ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                            CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),handler_00
                           );
    break;
  case LAST_ITERATED:
    iVar1 = ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                        in_stack_fffffffffffffdfc);
    ignore_zero_00 = (undefined1)((ulong)in_stack_fffffffffffffdf0 >> 0x38);
    BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
    uVar4 = (undefined4)in_RDI[2];
    num_args_00 = (int)((ulong)in_RDI[2] >> 0x20);
    ReadNumericExpr((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                    (bool)ignore_zero_00);
    NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginNumberOf
              ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
               CONCAT44(iVar1,in_stack_fffffffffffffe08),num_args_00,
               (NumericExpr)in_stack_fffffffffffffe10.impl_);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
    ::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::NumericExprReader,mp::BasicExprFactory<std::allocator<char>>::BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>>
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                *)in_stack_fffffffffffffe10.impl_,iVar1,
               (BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>_>
                *)CONCAT44(num_args_00,uVar4));
    handler_01.impl_._4_4_ = num_args_00;
    handler_01.impl_._0_4_ = uVar4;
    handler_01.arg_index_ = in_stack_fffffffffffffe08;
    handler_01._12_4_ = iVar1;
    local_8.impl_ =
         (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::EndNumberOf
                           ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                            CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),handler_01
                           );
    break;
  case NUMBEROF_SYM:
    iVar1 = ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                        in_stack_fffffffffffffdfc);
    BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
    ReadSymbolicExpr(in_stack_fffffffffffffe68);
    SVar3 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginSymbolicNumberOf
                      ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                       CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                       in_stack_fffffffffffffe04,(Expr)in_stack_fffffffffffffe10.impl_);
    local_1a8 = SVar3.impl_;
    local_1a0 = SVar3.arg_index_;
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
    ::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::SymbolicExprReader,mp::BasicExprFactory<std::allocator<char>>::BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)46,(mp::expr::Kind)46>>>
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                *)in_stack_fffffffffffffe10.impl_,in_stack_fffffffffffffe0c,
               (BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)46,_(mp::expr::Kind)46>_>
                *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    local_1b0 = CONCAT44(uStack_184,SVar3.arg_index_);
    handler_02.impl_._4_4_ = in_stack_fffffffffffffe04;
    handler_02.impl_._0_4_ = in_stack_fffffffffffffe00;
    handler_02.arg_index_ = in_stack_fffffffffffffe08;
    handler_02._12_4_ = in_stack_fffffffffffffe0c;
    local_1b8 = SVar3.impl_;
    local_8.impl_ =
         (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::
                 EndSymbolicNumberOf((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                                      *)CONCAT44(iVar1,in_stack_fffffffffffffdf8),handler_02);
    break;
  case COUNT:
    ReadCountExpr((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    other.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.impl_._4_4_ =
         in_stack_fffffffffffffe04;
    other.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.impl_._0_4_ =
         in_stack_fffffffffffffe00;
    BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
    BasicExpr<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
              ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),other,
               (type)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
  }
  return (NumericExpr)(ExprBase)local_8.impl_;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::FIRST_UNARY:
    return handler_.OnUnary(kind, ReadNumericExpr());
  case expr::FIRST_BINARY: {
    BinaryArgReader<> args(*this);
    return handler_.OnBinary(kind, args.lhs, args.rhs);
  }
  case expr::IF: {
    LogicalExpr condition = ReadLogicalExpr();
    NumericExpr then_expr = ReadNumericExpr();
    NumericExpr else_expr = ReadNumericExpr();
    return handler_.OnIf(condition, then_expr, else_expr);
  }
  case expr::PLTERM: {
    // Read a piecewise-linear term.
    int num_slopes = reader_.ReadUInt();
    if (num_slopes <= 1)
      reader_.ReportError("too few slopes in piecewise-linear term");
    reader_.ReadTillEndOfLine();
    typename Handler::PLTermHandler pl_handler =
        handler_.BeginPLTerm(num_slopes - 1);
    for (int i = 0; i < num_slopes - 1; ++i) {
      pl_handler.AddSlope(ReadConstant());
      pl_handler.AddBreakpoint(ReadConstant());
    }
    pl_handler.AddSlope(ReadConstant());
    return handler_.EndPLTerm(pl_handler, ReadReference());
  }
  case expr::FIRST_VARARG: {
    // Read a vararg expression (min or max).
    int num_args = ReadNumArgs(1);
    typename Handler::VarArgHandler args = handler_.BeginVarArg(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndVarArg(args);
  }
  case expr::SUM: {
    int num_args = ReadNumArgs();
    typename Handler::NumericArgHandler args = handler_.BeginSum(num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndSum(args);
  }
  case expr::COUNT:
    return ReadCountExpr();
  case expr::NUMBEROF: {
    // Read a numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::NumberOfArgHandler args =
        handler_.BeginNumberOf(num_args, ReadNumericExpr());
    DoReadArgs<NumericExprReader>(num_args - 1, args);
    return handler_.EndNumberOf(args);
  }
  case expr::NUMBEROF_SYM: {
    // Read a symbolic numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::SymbolicArgHandler args =
        handler_.BeginSymbolicNumberOf(num_args, ReadSymbolicExpr());
    DoReadArgs<SymbolicExprReader>(num_args - 1, args);
    return handler_.EndSymbolicNumberOf(args);
  }
  default:
    reader_.ReportError("expected numeric expression opcode");
  }
  return NumericExpr();
}